

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SearchableObjectHolder.hpp
# Opt level: O0

bool __thiscall
gmlc::concurrency::SearchableObjectHolder<helics::Broker,_helics::CoreType>::copyObject
          (SearchableObjectHolder<helics::Core,_helics::CoreType> *this,string *copyFromName,
          string *copyToName)

{
  bool bVar1;
  vector<helics::CoreType,_std::allocator<helics::CoreType>_> *in_RDX;
  pair<std::_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<helics::Broker>_>_>,_bool>
  pVar2;
  iterator fnd2;
  pair<std::_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<helics::Broker>_>_>,_bool>
  ret;
  shared_ptr<helics::Broker> newObjectPtr;
  iterator fnd;
  lock_guard<std::mutex> lock;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<helics::CoreType,_std::allocator<helics::CoreType>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<helics::CoreType,_std::allocator<helics::CoreType>_>_>_>_>
  *in_stack_ffffffffffffff08;
  shared_ptr<helics::Broker> *in_stack_ffffffffffffff10;
  undefined7 in_stack_ffffffffffffff18;
  undefined1 in_stack_ffffffffffffff1f;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<helics::CoreType,_std::allocator<helics::CoreType>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<helics::CoreType,_std::allocator<helics::CoreType>_>_>_>_>
  *in_stack_ffffffffffffff20;
  _Self local_88;
  _Self local_80;
  _Base_ptr local_78;
  undefined1 local_70;
  _Base_ptr local_68;
  byte local_60;
  _Self local_48 [3];
  _Self local_30 [2];
  vector<helics::CoreType,_std::allocator<helics::CoreType>_> *local_20;
  byte local_1;
  
  local_20 = in_RDX;
  std::lock_guard<std::mutex>::lock_guard
            ((lock_guard<std::mutex> *)in_stack_ffffffffffffff10,
             (mutex_type *)in_stack_ffffffffffffff08);
  local_30[0]._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<helics::Broker>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<helics::Broker>_>_>_>
       ::find((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<helics::Broker>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<helics::Broker>_>_>_>
               *)in_stack_ffffffffffffff08,(key_type *)0x43c3bf);
  local_48[0]._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<helics::Broker>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<helics::Broker>_>_>_>
       ::end((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<helics::Broker>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<helics::Broker>_>_>_>
              *)in_stack_ffffffffffffff08);
  bVar1 = std::operator==(local_30,local_48);
  if (((bVar1 ^ 0xffU) & 1) == 0) {
    local_1 = 0;
  }
  else {
    std::
    _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<helics::Broker>_>_>
    ::operator->((_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<helics::Broker>_>_>
                  *)0x43c416);
    std::shared_ptr<helics::Broker>::shared_ptr
              (in_stack_ffffffffffffff10,(shared_ptr<helics::Broker> *)in_stack_ffffffffffffff08);
    pVar2 = std::
            map<std::__cxx11::string,std::shared_ptr<helics::Broker>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::shared_ptr<helics::Broker>>>>
            ::emplace<std::__cxx11::string_const&,std::shared_ptr<helics::Broker>>
                      ((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<helics::Broker>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<helics::Broker>_>_>_>
                        *)in_stack_ffffffffffffff20,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       CONCAT17(in_stack_ffffffffffffff1f,in_stack_ffffffffffffff18),
                       in_stack_ffffffffffffff10);
    local_78 = (_Base_ptr)pVar2.first._M_node;
    local_70 = pVar2.second;
    local_68 = local_78;
    local_60 = local_70;
    if (((undefined1  [16])pVar2 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
      std::
      _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<helics::Broker>_>_>
      ::operator->((_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<helics::Broker>_>_>
                    *)0x43c4b4);
      local_80._M_node =
           (_Base_ptr)
           std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<helics::CoreType,_std::allocator<helics::CoreType>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<helics::CoreType,_std::allocator<helics::CoreType>_>_>_>_>
           ::find(in_stack_ffffffffffffff08,(key_type *)0x43c4c1);
      local_88._M_node =
           (_Base_ptr)
           std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<helics::CoreType,_std::allocator<helics::CoreType>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<helics::CoreType,_std::allocator<helics::CoreType>_>_>_>_>
           ::end(in_stack_ffffffffffffff08);
      bVar1 = std::operator==(&local_80,&local_88);
      if (((bVar1 ^ 0xffU) & 1) != 0) {
        std::
        _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<helics::CoreType,_std::allocator<helics::CoreType>_>_>_>
        ::operator->((_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<helics::CoreType,_std::allocator<helics::CoreType>_>_>_>
                      *)0x43c523);
        std::
        map<std::__cxx11::string,std::vector<helics::CoreType,std::allocator<helics::CoreType>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::vector<helics::CoreType,std::allocator<helics::CoreType>>>>>
        ::
        emplace<std::__cxx11::string_const&,std::vector<helics::CoreType,std::allocator<helics::CoreType>>&>
                  (in_stack_ffffffffffffff20,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT17(in_stack_ffffffffffffff1f,in_stack_ffffffffffffff18),local_20);
      }
    }
    local_1 = local_60 & 1;
    std::shared_ptr<helics::Broker>::~shared_ptr((shared_ptr<helics::Broker> *)0x43c5b7);
  }
  std::lock_guard<std::mutex>::~lock_guard((lock_guard<std::mutex> *)0x43c5d6);
  return (bool)(local_1 & 1);
}

Assistant:

bool copyObject(const std::string& copyFromName,
                    const std::string& copyToName)
    {
        std::lock_guard<std::mutex> lock(mapLock);
        auto fnd = objectMap.find(copyFromName);
        if (fnd != objectMap.end()) {
            auto newObjectPtr = fnd->second;
            auto ret = objectMap.emplace(copyToName, std::move(newObjectPtr));
            if (ret.second) {
                auto fnd2 = typeMap.find(fnd->first);
                if (fnd2 != typeMap.end()) {
                    typeMap.emplace(copyToName, fnd2->second);
                }
            }

            return ret.second;
        }
        return false;
    }